

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADPComponentDiscreteActions.cpp
# Opt level: O0

bool __thiscall
MADPComponentDiscreteActions::SetInitialized(MADPComponentDiscreteActions *this,bool b)

{
  value_type vVar1;
  byte bVar2;
  size_t *psVar3;
  size_type sVar4;
  reference pvVar5;
  void *__s;
  byte in_SIL;
  long in_RDI;
  Index i;
  size_t prevNrJA;
  size_t nrJA;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffffb8;
  uint local_2c;
  ulong local_20;
  
  bVar2 = in_SIL & 1;
  if (bVar2 == 0) {
    if (((*(byte *)(in_RDI + 8) & 1) == 1) && (*(void **)(in_RDI + 0x18) != (void *)0x0)) {
      operator_delete__(*(void **)(in_RDI + 0x18));
    }
    *(undefined1 *)(in_RDI + 8) = 0;
  }
  else {
    if ((((*(byte *)(in_RDI + 8) & 1) == 1) && (bVar2 == 1)) &&
       (in_stack_ffffffffffffffb8 =
             *(vector<unsigned_long,_std::allocator<unsigned_long>_> **)(in_RDI + 0x18),
       in_stack_ffffffffffffffb8 != (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0)) {
      operator_delete__(in_stack_ffffffffffffffb8);
    }
    if (bVar2 == 1) {
      psVar3 = IndexTools::CalculateStepSize(in_stack_ffffffffffffffb8);
      *(size_t **)(in_RDI + 0x18) = psVar3;
      if ((*(byte *)(in_RDI + 9) & 1) == 0) {
        local_20 = 1;
        for (local_2c = 0;
            sVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                               (in_RDI + 0x40)), local_2c != sVar4; local_2c = local_2c + 1) {
          pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                              (in_RDI + 0x40),(ulong)local_2c);
          vVar1 = *pvVar5;
          if (vVar1 * local_20 < local_20) {
            *(undefined1 *)(in_RDI + 10) = 0;
          }
          local_20 = vVar1 * local_20;
        }
        *(ulong *)(in_RDI + 0x10) = local_20;
        __s = operator_new(0x30);
        memset(__s,0,0x30);
        std::
        map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>_>
        ::map((map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>_>
               *)0xacda3c);
        *(void **)(in_RDI + 0x38) = __s;
      }
      else {
        sVar4 = std::vector<JointActionDiscrete_*,_std::allocator<JointActionDiscrete_*>_>::size
                          ((vector<JointActionDiscrete_*,_std::allocator<JointActionDiscrete_*>_> *)
                           (in_RDI + 0x20));
        *(size_type *)(in_RDI + 0x10) = sVar4;
      }
      *(undefined1 *)(in_RDI + 8) = 1;
    }
  }
  return true;
}

Assistant:

bool MADPComponentDiscreteActions::SetInitialized(bool b)
{
    if(b == false)
    {
        if(_m_initialized == true)
            delete [] _m_actionStepSize;
        _m_initialized = b;
        return true;
    }
    if(_m_initialized == true && b == true)
    {
        //first free mem before re-initialize:
        delete [] _m_actionStepSize;
    }
    if(b == true)
    {
        _m_actionStepSize=IndexTools::CalculateStepSize(_m_nrActions);

        if(!_m_cachedAllJointActions)
        {
            size_t nrJA=1;
            size_t prevNrJA=nrJA;
            for(Index i=0;i!=_m_nrActions.size();++i)
            {
                nrJA*=_m_nrActions[i];
                // detect overflow
                if(nrJA<prevNrJA)
                    _m_jointIndicesValid=false;
                prevNrJA=nrJA;
            }
            _m_nrJointActions=nrJA;
            _m_jointActionIndices=
                new map<Index, vector<Index> *>();
        }
        else
            _m_nrJointActions=_m_jointActionVec.size();
        _m_initialized = b;
    }
    return(true);
}